

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::optional<tinyusdz::CollectionInstance::ExpansionRule>::operator=
          (optional<tinyusdz::CollectionInstance::ExpansionRule> *this,
          optional<tinyusdz::CollectionInstance::ExpansionRule> *other)

{
  value_type vVar1;
  bool bVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  optional<tinyusdz::CollectionInstance::ExpansionRule> *other_local;
  optional<tinyusdz::CollectionInstance::ExpansionRule> *this_local;
  
  bVar2 = has_value(this);
  if ((!bVar2) || (bVar2 = has_value(other), bVar2)) {
    bVar2 = has_value(this);
    if ((bVar2) || (bVar2 = has_value(other), !bVar2)) {
      bVar2 = has_value(this);
      if ((bVar2) && (bVar2 = has_value(other), bVar2)) {
        pvVar3 = operator*(other);
        vVar1 = *pvVar3;
        pvVar4 = detail::storage_t<tinyusdz::CollectionInstance::ExpansionRule>::value
                           ((storage_t<tinyusdz::CollectionInstance::ExpansionRule> *)
                            &this->contained);
        *pvVar4 = vVar1;
      }
    }
    else {
      pvVar3 = operator*(other);
      initialize<tinyusdz::CollectionInstance::ExpansionRule>(this,pvVar3);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }